

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O1

MOJOSHADER_irExpression *
build_ir_increxpr(Context_conflict *ctx,MOJOSHADER_astDataType *_dt,int val)

{
  MOJOSHADER_astDataTypeType MVar1;
  uint uVar2;
  MOJOSHADER_astDataType *dt;
  MOJOSHADER_astDataType *pMVar3;
  MOJOSHADER_irExpression *pMVar4;
  ulong uVar5;
  
  dt = reduce_datatype(ctx,_dt);
  pMVar3 = datatype_base(ctx,dt);
  MVar1 = pMVar3->type;
  uVar2 = datatype_elems(ctx,dt);
  pMVar4 = (MOJOSHADER_irExpression *)(*ctx->malloc)(0x60,ctx->malloc_data);
  if (pMVar4 == (MOJOSHADER_irExpression *)0x0) {
    ctx->isfail = 1;
    ctx->out_of_memory = 1;
    pMVar4 = (MOJOSHADER_irExpression *)0x0;
  }
  else {
    (pMVar4->ir).type = MOJOSHADER_IR_CONSTANT;
    (pMVar4->ir).filename = ctx->sourcefile;
    (pMVar4->ir).line = ctx->sourceline;
    (pMVar4->info).type = MVar1;
    (pMVar4->info).elements = uVar2;
  }
  if (MVar1 - MOJOSHADER_AST_DATATYPE_FLOAT < 5) {
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        *(float *)((long)pMVar4 + uVar5 * 4 + 0x20) = (float)val;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  else {
    if (2 < MVar1 - MOJOSHADER_AST_DATATYPE_BOOL) {
      __assert_fail("0 && \"Semantic analysis should have caught this!\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_compiler.c"
                    ,0x144e,
                    "MOJOSHADER_irExpression *build_ir_increxpr(Context *, const MOJOSHADER_astDataType *, const int)"
                   );
    }
    if (0 < (int)uVar2) {
      uVar5 = 0;
      do {
        *(int *)((long)pMVar4 + uVar5 * 4 + 0x20) = val;
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
  }
  return pMVar4;
}

Assistant:

static MOJOSHADER_irExpression *build_ir_increxpr(Context *ctx, const MOJOSHADER_astDataType *_dt,
                                                  const int val)
{
    const MOJOSHADER_astDataType *dt = reduce_datatype(ctx, _dt);
    const MOJOSHADER_astDataTypeType type = datatype_base(ctx, dt)->type;
    const int elems = datatype_elems(ctx, dt);
    MOJOSHADER_irConstant *retval = (MOJOSHADER_irConstant *) new_ir_constant(ctx, type, elems);
    int i;

    switch (type)
    {
        case MOJOSHADER_AST_DATATYPE_BOOL:
        case MOJOSHADER_AST_DATATYPE_INT:
        case MOJOSHADER_AST_DATATYPE_UINT:
            for (i = 0; i < elems; i++)
                retval->value.ival[i] = (int) val;
            break;

        case MOJOSHADER_AST_DATATYPE_FLOAT:
        case MOJOSHADER_AST_DATATYPE_FLOAT_SNORM:
        case MOJOSHADER_AST_DATATYPE_FLOAT_UNORM:
        case MOJOSHADER_AST_DATATYPE_HALF:
        case MOJOSHADER_AST_DATATYPE_DOUBLE:
            for (i = 0; i < elems; i++)
                retval->value.fval[i] = (float) val;
            break;

        default:
            assert(0 && "Semantic analysis should have caught this!");
    } // switch

    return (MOJOSHADER_irExpression *) retval;
}